

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ComponentManager.cpp
# Opt level: O3

ErrorCode __thiscall
ComponentManager::GetService(ComponentManager *this,CID cid,IID iid,void **object)

{
  Node *pNVar1;
  ClassInfo *pCVar2;
  ISupports *pIVar3;
  uint in_EAX;
  int iVar4;
  undefined4 extraout_var;
  Node *pNVar5;
  ErrorCode result;
  undefined8 uStack_38;
  
  uStack_38 = (ulong)in_EAX;
  pNVar5 = (this->mClasses).mHead;
  pNVar1 = (this->mClasses).mTail;
  do {
    pNVar5 = pNVar5->next;
    if (pNVar5 == pNVar1) {
      return kNoClass;
    }
    pCVar2 = pNVar5->val;
    iVar4 = strcmp((pCVar2->mCid).mId,cid.mId);
  } while (iVar4 != 0);
  pIVar3 = pCVar2->mClass;
  iVar4 = (*pIVar3->_vptr_ISupports[2])(pIVar3,iid.mId,(long)&uStack_38 + 4);
  *object = (void *)CONCAT44(extraout_var,iVar4);
  return uStack_38._4_4_;
}

Assistant:

ErrorCode ComponentManager::GetService( CID cid, IID iid, void **object )
{
	TRACE_BEGIN( LOG_LVL_NOISE );
	ErrorCode result = kNoError;
	ClassInfo match( cid );

	ClassInfo *info = NULL;

	for (JetHead::list<ClassInfo*>::iterator i = mClasses.begin(); 
		 i != mClasses.end(); ++i)
	{
		if (*(*i) == match)
		{
			info = *i;
			break;
		}
	}
	
	LOG( "info is %p", info );
	
	if ( info != NULL )
		*object = info->mClass->QueryInterface( iid, &result );
	else
		result = kNoClass;

	return result;
}